

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O0

void graphics101::unordered_edges_from_triangles
               (vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *triangles,
               Edges *edges_out)

{
  size_t this;
  bool bVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  size_type __new_size;
  reference pvVar5;
  pair<std::_Rb_tree_const_iterator<std::pair<long,_long>_>,_bool> pVar6;
  value_type local_120;
  reference local_118;
  pair<long,_long> *it;
  iterator __end1_1;
  iterator __begin1_1;
  edge_set_t *__range1_1;
  int e;
  pair<int,_int> local_e0;
  pair<long,_long> local_d8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  pair<int,_int> local_b8;
  pair<long,_long> local_b0;
  _Base_ptr local_a0;
  undefined1 local_98;
  pair<int,_int> local_80;
  pair<long,_long> local_78;
  Triangle *local_68;
  Triangle *tri;
  const_iterator __end1;
  const_iterator __begin1;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *__range1;
  edge_set_t edges;
  Edges *edges_out_local;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *triangles_local;
  
  edges._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)edges_out;
  std::
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::set((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
         *)&__range1);
  __end1 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::begin
                     (triangles);
  tri = (Triangle *)
        std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::end(triangles);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
                                *)&tri);
    this = edges._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<const_graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
               ::operator*(&__end1);
    piVar2 = Triangle::operator[](local_68,0);
    piVar3 = Triangle::operator[](local_68,1);
    piVar2 = std::min<int>(piVar2,piVar3);
    piVar3 = Triangle::operator[](local_68,0);
    piVar4 = Triangle::operator[](local_68,1);
    piVar3 = std::max<int>(piVar3,piVar4);
    local_80 = std::make_pair<int_const&,int_const&>(piVar2,piVar3);
    std::pair<long,_long>::pair<int,_int,_true>(&local_78,&local_80);
    pVar6 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::insert((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                      *)&__range1,&local_78);
    local_a0 = (_Base_ptr)pVar6.first._M_node;
    local_98 = pVar6.second;
    piVar2 = Triangle::operator[](local_68,1);
    piVar3 = Triangle::operator[](local_68,2);
    piVar2 = std::min<int>(piVar2,piVar3);
    piVar3 = Triangle::operator[](local_68,1);
    piVar4 = Triangle::operator[](local_68,2);
    piVar3 = std::max<int>(piVar3,piVar4);
    local_b8 = std::make_pair<int_const&,int_const&>(piVar2,piVar3);
    std::pair<long,_long>::pair<int,_int,_true>(&local_b0,&local_b8);
    pVar6 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::insert((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                      *)&__range1,&local_b0);
    local_c8 = (_Base_ptr)pVar6.first._M_node;
    local_c0 = pVar6.second;
    piVar2 = Triangle::operator[](local_68,2);
    piVar3 = Triangle::operator[](local_68,0);
    piVar2 = std::min<int>(piVar2,piVar3);
    piVar3 = Triangle::operator[](local_68,2);
    piVar4 = Triangle::operator[](local_68,0);
    piVar3 = std::max<int>(piVar3,piVar4);
    local_e0 = std::make_pair<int_const&,int_const&>(piVar2,piVar3);
    std::pair<long,_long>::pair<int,_int,_true>(&local_d8,&local_e0);
    std::
    set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
    ::insert((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
              *)&__range1,&local_d8);
    __gnu_cxx::
    __normal_iterator<const_graphics101::Triangle_*,_std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>_>
    ::operator++(&__end1);
  }
  __new_size = std::
               set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
               ::size((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                       *)&__range1);
  std::
  vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ::resize((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
            *)this,__new_size);
  __range1_1._4_4_ = 0;
  __end1_1 = std::
             set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
             ::begin((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                      *)&__range1);
  it = (pair<long,_long> *)
       std::
       set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
       ::end((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
              *)&__range1);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&it);
    if (!bVar1) break;
    local_118 = std::_Rb_tree_const_iterator<std::pair<long,_long>_>::operator*(&__end1_1);
    glm::vec<2,int,(glm::qualifier)0>::vec<long,long>
              ((vec<2,int,(glm::qualifier)0> *)&local_120,local_118->first,local_118->second);
    pvVar5 = std::
             vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
             ::at((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                   *)edges._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)__range1_1._4_4_);
    *pvVar5 = local_120;
    __range1_1._4_4_ = __range1_1._4_4_ + 1;
    std::_Rb_tree_const_iterator<std::pair<long,_long>_>::operator++(&__end1_1);
  }
  std::
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::~set((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
          *)&__range1);
  return;
}

Assistant:

void unordered_edges_from_triangles( const std::vector< Triangle >& triangles, HalfEdgeTriMesh::Edges& edges_out )
{
    typedef HalfEdgeTriMesh::Index Index;
    typedef HalfEdgeTriMesh::Edge Edge;
    typedef std::set< std::pair< Index, Index > > edge_set_t;
    edge_set_t edges;
    for( const auto& tri : triangles )
    {
        edges.insert( std::make_pair( std::min( tri[0], tri[1] ), std::max( tri[0], tri[1] ) ) );
        edges.insert( std::make_pair( std::min( tri[1], tri[2] ), std::max( tri[1], tri[2] ) ) );
        edges.insert( std::make_pair( std::min( tri[2], tri[0] ), std::max( tri[2], tri[0] ) ) );
    }

    edges_out.resize( edges.size() );
    int e = 0;
    for( const auto& it : edges )
    {
        edges_out.at(e) = Edge( it.first, it.second );
        ++e;
    }
}